

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

void __thiscall xmrig::OclCnRunner::build(OclCnRunner *this)

{
  Cn2Kernel *this_00;
  Cn1Kernel *this_01;
  cl_program p_Var1;
  reference ppCVar2;
  cl_mem in_RDI;
  CnBranchKernel *kernel;
  size_t i;
  cl_program in_stack_ffffffffffffff98;
  cl_program in_stack_ffffffffffffffa0;
  cl_mem in_stack_ffffffffffffffa8;
  cl_program in_stack_ffffffffffffffb0;
  cl_mem in_stack_ffffffffffffffb8;
  cl_program states;
  OclBaseRunner *in_stack_ffffffffffffffc0;
  ulong local_20;
  
  OclBaseRunner::build(in_stack_ffffffffffffffc0);
  this_00 = (Cn2Kernel *)operator_new(0x20);
  Cn2Kernel::Cn2Kernel((Cn2Kernel *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(Cn2Kernel **)(in_RDI + 0xd0) = this_00;
  Cn2Kernel::setArgs(this_00,in_RDI,(cl_mem)in_stack_ffffffffffffffc0,
                     (vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *)in_stack_ffffffffffffffb8,
                     (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  this_01 = (Cn1Kernel *)operator_new(0x20);
  Cn1Kernel::Cn1Kernel((Cn1Kernel *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(Cn1Kernel **)(in_RDI + 200) = this_01;
  Cn1Kernel::setArgs(this_01,in_stack_ffffffffffffffb8,(cl_mem)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,(uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20))
  ;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    p_Var1 = (cl_program)operator_new(0x20);
    CnBranchKernel::CnBranchKernel
              ((CnBranchKernel *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa8 = *(cl_mem *)(in_RDI + 0xb0);
    in_stack_ffffffffffffffa0 = p_Var1;
    states = p_Var1;
    std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::operator[]
              ((vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *)(in_RDI + 0xe0),local_20);
    CnBranchKernel::setArgs
              ((CnBranchKernel *)this_01,(cl_mem)states,(cl_mem)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,(uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    ppCVar2 = std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::
              operator[]((vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
                          *)(in_RDI + 0xf8),local_20);
    *ppCVar2 = (value_type)p_Var1;
    in_stack_ffffffffffffffb0 = p_Var1;
  }
  return;
}

Assistant:

void xmrig::OclCnRunner::build()
{
    OclBaseRunner::build();

    m_cn2 = new Cn2Kernel(m_program);
    m_cn2->setArgs(m_scratchpads, m_states, m_branches, m_intensity);

    m_cn1 = new Cn1Kernel(m_program);
    m_cn1->setArgs(m_input, m_scratchpads, m_states, m_intensity);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        auto kernel = new CnBranchKernel(i, m_program);
        kernel->setArgs(m_states, m_branches[i], m_output, m_intensity);

        m_branchKernels[i] = kernel;
    }
}